

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  long lVar4;
  lua_State *L;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  pcVar1 = *argv;
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
    progname = pcVar1;
  }
  if (argc < 2) {
    iVar6 = 1;
    iVar3 = 0;
  }
  else {
    iVar6 = 1;
    iVar3 = 0;
    iVar5 = listing;
    while( true ) {
      pcVar1 = argv[iVar6];
      if (*pcVar1 != '-') break;
      iVar2 = strcmp(pcVar1,"--");
      if (iVar2 == 0) {
        iVar6 = iVar6 + 1;
        bVar7 = iVar3 == 0;
        iVar3 = iVar3 + 1;
        if (bVar7) {
          iVar3 = 0;
        }
        break;
      }
      iVar2 = strcmp(pcVar1,"-");
      if (iVar2 == 0) break;
      iVar2 = strcmp(pcVar1,"-l");
      if (iVar2 == 0) {
        iVar5 = iVar5 + 1;
        listing = iVar5;
      }
      else {
        iVar2 = strcmp(pcVar1,"-o");
        if (iVar2 == 0) {
          output = argv[(long)iVar6 + 1];
          if (output != (char *)0x0) {
            if (*output == '-') {
              if (output[1] == '\0') goto LAB_00103a15;
            }
            else if (*output != '\0') {
LAB_00103a15:
              iVar6 = iVar6 + 1;
              iVar2 = strcmp(output,"-");
              if (iVar2 == 0) {
                output = (char *)0x0;
              }
              goto LAB_00103a3c;
            }
          }
          usage("\'-o\' needs argument");
          goto LAB_00103b43;
        }
        iVar2 = strcmp(pcVar1,"-p");
        if (iVar2 == 0) {
          dumping = 1;
        }
        else {
          iVar2 = strcmp(pcVar1,"-s");
          if (iVar2 == 0) {
            stripping = 1;
          }
          else {
            iVar2 = strcmp(pcVar1,"-v");
            if (iVar2 != 0) {
              usage(pcVar1);
              return extraout_EAX;
            }
            iVar3 = iVar3 + 1;
          }
        }
      }
LAB_00103a3c:
      iVar6 = iVar6 + 1;
      if (argc <= iVar6) break;
    }
  }
  if ((iVar6 == argc) && ((listing != 0 || ((dumping & 1) != 0)))) {
    dumping = 1;
    lVar4 = (long)iVar6;
    iVar6 = iVar6 + -1;
    argv[lVar4 + -1] = Output;
  }
  if ((iVar3 != 0) &&
     (puts("Lua 5.4.7  Copyright (C) 1994-2024 Lua.org, PUC-Rio"), iVar3 == argc + -1))
  goto LAB_00103b59;
  if (argc - iVar6 == 0 || argc < iVar6) {
LAB_00103b43:
    usage("no input files given");
LAB_00103b4f:
    main_cold_2();
  }
  else {
    L = luaL_newstate();
    if (L == (lua_State *)0x0) goto LAB_00103b4f;
    lua_pushcclosure(L,pmain,0);
    lua_pushinteger(L,(ulong)(uint)(argc - iVar6));
    lua_pushlightuserdata(L,argv + iVar6);
    iVar3 = lua_pcallk(L,2,0,0,0,(lua_KFunction)0x0);
    if (iVar3 == 0) {
      lua_close(L);
      return 0;
    }
  }
  main_cold_1();
LAB_00103b59:
  exit(0);
}

Assistant:

int main(int argc, char* argv[])
{
 lua_State* L;
 int i=doargs(argc,argv);
 argc-=i; argv+=i;
 if (argc<=0) usage("no input files given");
 L=luaL_newstate();
 if (L==NULL) fatal("cannot create state: not enough memory");
 lua_pushcfunction(L,&pmain);
 lua_pushinteger(L,argc);
 lua_pushlightuserdata(L,argv);
 if (lua_pcall(L,2,0,0)!=LUA_OK) fatal(lua_tostring(L,-1));
 lua_close(L);
 return EXIT_SUCCESS;
}